

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.h
# Opt level: O0

void __thiscall enact::ParametricTypename::~ParametricTypename(ParametricTypename *this)

{
  ParametricTypename *this_local;
  
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__ParametricTypename_0016a950;
  std::__cxx11::string::~string((string *)&this->m_name);
  std::
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ::~vector(&this->m_parameterTypenames);
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
            (&this->m_constructorTypename);
  Typename::~Typename(&this->super_Typename);
  return;
}

Assistant:

~ParametricTypename() override = default;